

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O2

JavascriptGeneratorFunction *
Js::JavascriptGeneratorFunction::OP_NewScGenFunc
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  bool bVar1;
  FunctionProxy *this;
  ThreadContext *pTVar2;
  bool bVar3;
  ScriptContext *scriptContext;
  GeneratorVirtualScriptFunction *scriptFunction;
  JavascriptGeneratorFunction *ptr;
  
  this = (infoRef->ptr->functionBodyImpl).ptr;
  scriptContext = FunctionProxy::GetScriptContext(this);
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  scriptFunction =
       JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                 ((scriptContext->super_ScriptContextBase).javascriptLibrary,this);
  ScriptFunction::SetEnvironment(&scriptFunction->super_ScriptFunction,environment);
  bVar3 = FunctionProxy::IsAsync(this);
  if (bVar3) {
    bVar3 = FunctionProxy::IsModule(this);
    if (!bVar3) {
      bVar3 = FunctionProxy::IsGenerator(this);
      if (bVar3) {
        ptr = &JavascriptAsyncGeneratorFunction::New(scriptContext,scriptFunction)->
               super_JavascriptGeneratorFunction;
      }
      else {
        ptr = &JavascriptAsyncFunction::New(scriptContext,scriptFunction)->
               super_JavascriptGeneratorFunction;
      }
      goto LAB_00a8facf;
    }
  }
  ptr = New(scriptContext,scriptFunction);
LAB_00a8facf:
  Memory::WriteBarrierPtr<Js::JavascriptGeneratorFunction>::WriteBarrierSet
            (&scriptFunction->realFunction,ptr);
  pTVar2->noJsReentrancy = bVar1;
  return ptr;
}

Assistant:

JavascriptGeneratorFunction* JavascriptGeneratorFunction::OP_NewScGenFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        ScriptContext* scriptContext = functionProxy->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScGenFunc, reentrancylock, scriptContext->GetThreadContext());

        GeneratorVirtualScriptFunction* scriptFunction = scriptContext->GetLibrary()->CreateGeneratorVirtualScriptFunction(functionProxy);
        scriptFunction->SetEnvironment(environment);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(scriptFunction, EtwTrace::GetFunctionId(functionProxy)));

        JavascriptGeneratorFunction* genFunc = nullptr;
        if (functionProxy->IsAsync() && !functionProxy->IsModule())
        {
            if (functionProxy->IsGenerator())
            {
                genFunc = JavascriptAsyncGeneratorFunction::New(scriptContext, scriptFunction);
            }
            else
            {
                genFunc = JavascriptAsyncFunction::New(scriptContext, scriptFunction);
            }
        }
        else
        {
            genFunc = JavascriptGeneratorFunction::New(scriptContext, scriptFunction);
        }

        scriptFunction->SetRealGeneratorFunction(genFunc);

        return genFunc;
        JIT_HELPER_END(ScrFunc_OP_NewScGenFunc);
    }